

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_namedict.c
# Opt level: O2

HPDF_Dict HPDF_EmbeddedFile_GetParams(HPDF_EmbeddedFile emfile)

{
  HPDF_Dict dict;
  HPDF_Dict p_Var1;
  HPDF_STATUS HVar2;
  
  dict = HPDF_EmbeddedFile_GetFileStream(emfile);
  if (dict != (HPDF_Dict)0x0) {
    p_Var1 = (HPDF_Dict)HPDF_Dict_GetItem(dict,"Params",0x11);
    if (p_Var1 != (HPDF_Dict)0x0) {
      return p_Var1;
    }
    p_Var1 = HPDF_Dict_New(emfile->mmgr);
    if (p_Var1 != (HPDF_Dict)0x0) {
      HVar2 = HPDF_Dict_Add(dict,"Params",p_Var1);
      if (HVar2 != 0) {
        return (HPDF_Dict)0x0;
      }
      return p_Var1;
    }
  }
  return (HPDF_Dict)0x0;
}

Assistant:

static HPDF_Dict
HPDF_EmbeddedFile_GetParams  (HPDF_EmbeddedFile  emfile)
{
    HPDF_Dict filestream;
    HPDF_Dict params;

    filestream = HPDF_EmbeddedFile_GetFileStream(emfile);
    if (!filestream)
        return NULL;

    params = HPDF_Dict_GetItem(filestream, "Params", HPDF_OCLASS_DICT);
    if (!params) {
        params = HPDF_Dict_New (emfile->mmgr);
        if (!params || HPDF_Dict_Add (filestream, "Params", params) != HPDF_OK)
            return NULL;
    }
    return params;
}